

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteF64
          (BinaryWriterSpec *this,uint64_t f64_bits,ExpectedNan expected)

{
  ExpectedNan expected_local;
  uint64_t f64_bits_local;
  BinaryWriterSpec *this_local;
  
  if (expected == None) {
    Stream::Writef(this->json_stream_,"\"%lu\"",f64_bits);
  }
  else if (expected == Canonical) {
    WriteString(this,"nan:canonical");
  }
  else if (expected == Arithmetic) {
    WriteString(this,"nan:arithmetic");
  }
  return;
}

Assistant:

void BinaryWriterSpec::WriteF64(uint64_t f64_bits, ExpectedNan expected) {
  switch (expected) {
    case ExpectedNan::None:
      json_stream_->Writef("\"%" PRIu64 "\"", f64_bits);
      break;

    case ExpectedNan::Arithmetic:
      WriteString("nan:arithmetic");
      break;

    case ExpectedNan::Canonical:
      WriteString("nan:canonical");
      break;
  }
}